

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O0

void __thiscall
Diligent::GLContextState::SetColorWriteMaskIndexed
          (GLContextState *this,Uint32 RTIndex,Uint32 WriteMask)

{
  Char *Message;
  undefined1 local_40 [8];
  string msg;
  GLenum err;
  Uint32 WriteMask_local;
  Uint32 RTIndex_local;
  GLContextState *this_local;
  
  if (this->m_ColorWriteMasks[RTIndex] != WriteMask) {
    (*__glewColorMaski)(RTIndex,(WriteMask & 1) != 0,(WriteMask & 2) != 0,(WriteMask & 4) != 0,
                        (WriteMask & 8) != 0);
    msg.field_2._12_4_ = glGetError();
    if (msg.field_2._12_4_ != 0) {
      LogError<false,char[28],char[17],unsigned_int>
                (false,"SetColorWriteMaskIndexed",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x37e,(char (*) [28])"Failed to set GL color mask",
                 (char (*) [17])"\nGL Error Code: ",(uint *)(msg.field_2._M_local_buf + 0xc));
      FormatString<char[6]>((string *)local_40,(char (*) [6])0x4585f6);
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"SetColorWriteMaskIndexed",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x37e);
      std::__cxx11::string::~string((string *)local_40);
    }
    this->m_ColorWriteMasks[RTIndex] = WriteMask;
    EnableStateHelper::operator=(&this->m_bIndexedWriteMasks,true);
  }
  return;
}

Assistant:

void GLContextState::SetColorWriteMaskIndexed(Uint32 RTIndex, Uint32 WriteMask)
{
    // Even though the write mask only applies to writes to a framebuffer, the mask state is NOT
    // Framebuffer state. So it is NOT part of a Framebuffer Object or the Default Framebuffer.
    // Binding a new framebuffer will NOT affect the mask.
    if (m_ColorWriteMasks[RTIndex] == WriteMask)
        return;

    // Note that glColorMaski() does not set color mask for the framebuffer
    // attachment point RTIndex. Rather it sets the mask for what was set
    // by the glDrawBuffers() function for the i-th output
    glColorMaski(RTIndex,
                 (WriteMask & COLOR_MASK_RED) ? GL_TRUE : GL_FALSE,
                 (WriteMask & COLOR_MASK_GREEN) ? GL_TRUE : GL_FALSE,
                 (WriteMask & COLOR_MASK_BLUE) ? GL_TRUE : GL_FALSE,
                 (WriteMask & COLOR_MASK_ALPHA) ? GL_TRUE : GL_FALSE);
    DEV_CHECK_GL_ERROR("Failed to set GL color mask");

    m_ColorWriteMasks[RTIndex] = WriteMask;

    m_bIndexedWriteMasks = true;
}